

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TestResult *result_00;
  ostream *poVar5;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TimeInMillis ms_01;
  TimeInMillis ms_02;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  TestResult *local_38;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_allocated_capacity._0_5_ = 0x20202020;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name","");
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"NonTestSuiteFailure","");
  paVar4 = &local_58.field_2;
  local_58._M_string_length = 6;
  local_58.field_2._M_allocated_capacity._0_7_ = 0x202020202020;
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"tests","");
  local_78.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_78.field_2._M_allocated_capacity._4_2_ = 0x2020;
  local_78._M_string_length = 6;
  local_78.field_2._M_local_buf[6] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar3;
  OutputJsonKey(stream,&local_b8,&local_98,1,&local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_list_tests == '\0') {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"failures","");
    local_78.field_2._M_allocated_capacity._0_4_ = 0x20202020;
    local_78.field_2._M_allocated_capacity._4_2_ = 0x2020;
    local_78._M_string_length = 6;
    local_78.field_2._M_local_buf[6] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar3;
    OutputJsonKey(stream,&local_b8,&local_98,1,&local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"disabled","");
    local_78.field_2._M_allocated_capacity._0_4_ = 0x20202020;
    local_78.field_2._M_allocated_capacity._4_2_ = 0x2020;
    local_78._M_string_length = 6;
    local_78.field_2._M_local_buf[6] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar3;
    OutputJsonKey(stream,&local_b8,&local_98,0,&local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"skipped","");
    local_78.field_2._M_allocated_capacity._0_4_ = 0x20202020;
    local_78.field_2._M_allocated_capacity._4_2_ = 0x2020;
    local_78._M_string_length = 6;
    local_78.field_2._M_local_buf[6] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar3;
    OutputJsonKey(stream,&local_b8,&local_98,0,&local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"errors","");
    local_78.field_2._M_allocated_capacity._0_4_ = 0x20202020;
    local_78.field_2._M_allocated_capacity._4_2_ = 0x2020;
    local_78._M_string_length = 6;
    local_78.field_2._M_local_buf[6] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar3;
    OutputJsonKey(stream,&local_b8,&local_98,0,&local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_78,(internal *)result->elapsed_time_,ms);
    local_58._M_string_length = 6;
    local_58.field_2._M_allocated_capacity._0_7_ = 0x202020202020;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar4) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testsuite","");
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_78,(internal *)result->start_timestamp_,ms_00);
    local_58._M_string_length = 6;
    local_58.field_2._M_allocated_capacity._0_7_ = 0x202020202020;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar4) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 local_78.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_b8._M_string_length = 6;
  local_b8.field_2._M_allocated_capacity._0_7_ = 0x202020202020;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"testsuite\": [\n",0xf);
  local_38 = result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8.field_2._M_allocated_capacity = 0x2020202020202020;
  local_b8._M_string_length = 8;
  local_b8.field_2._M_local_buf[8] = '\0';
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name","");
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"status","");
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RUN","");
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"result","");
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"COMPLETED","");
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_78,(internal *)local_38->start_timestamp_,ms_01);
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_78,(internal *)local_38->elapsed_time_,ms_02);
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testcase","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"classname","");
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_58.field_2._M_allocated_capacity = 0x2020202020202020;
  local_58.field_2._8_2_ = 0x2020;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar4;
  OutputJsonKey(stream,&local_b8,&local_98,&local_78,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               local_78.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  result_00 = local_38;
  local_98.field_2._M_allocated_capacity = 0x2020202020202020;
  local_98.field_2._8_2_ = 0x2020;
  local_98._M_string_length = 10;
  local_98.field_2._M_local_buf[10] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar2;
  TestPropertiesAsJson(&local_b8,local_38,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  OutputJsonTestResult(stream,result_00);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  local_b8._M_string_length = 6;
  local_b8.field_2._M_allocated_capacity._0_7_ = 0x202020202020;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  local_98._M_string_length = 4;
  local_98.field_2._M_allocated_capacity._0_5_ = 0x20202020;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,paVar2->_M_local_buf,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}